

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void kratos::MixedAssignmentVisitor::checkout_assignment(Generator *generator,string *name)

{
  int iVar1;
  Stmt *stmt;
  int iVar2;
  long lVar3;
  pointer ppSVar4;
  StmtException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  int iVar5;
  long *plVar6;
  basic_string_view<char> bVar7;
  string_view format_str;
  format_args args;
  string local_a0;
  const_iterator local_80;
  const_iterator local_78;
  size_type sStack_70;
  pointer local_68;
  size_type sStack_60;
  undefined1 auStack_58 [8];
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmt_list;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  Generator::get_var((Generator *)
                     &stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)generator);
  lVar3 = (*(code *)(*stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->parent_)();
  plVar6 = (long *)(lVar3 + 0x10);
  iVar5 = 2;
  while( true ) {
    do {
      plVar6 = (long *)*plVar6;
      if (plVar6 == (long *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        return;
      }
      ppSVar4 = (pointer)(**(code **)(**(long **)(plVar6[1] + 0xc0) + 0x148))();
    } while (ppSVar4 !=
             stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
    stmt = (Stmt *)plVar6[1];
    iVar1 = *(int *)&stmt[1].super_IRNode.fn_name_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
    iVar2 = iVar1;
    if ((iVar5 != 2) && (iVar2 = iVar5, iVar5 != iVar1)) break;
    iVar5 = iVar2;
    check_var_parent(generator,(Var *)stmt[1].super_IRNode._vptr_IRNode,
                     (Var *)stmt[1].super_IRNode.fn_name_ln.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,stmt);
  }
  auStack_58 = (undefined1  [8])0x0;
  stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = (*(code *)(*stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->parent_)();
  std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::reserve
            ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)auStack_58,
             *(size_type *)(lVar3 + 0x18));
  lVar3 = (*(code *)(*stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->parent_)();
  plVar6 = (long *)(lVar3 + 0x10);
  while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
    local_78._M_current = (Stmt **)plVar6[1];
    std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::AssignStmt*>
              ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)auStack_58,
               (AssignStmt **)&local_78);
  }
  this = (StmtException *)__cxa_allocate_exception(0x10);
  local_78._M_current = (Stmt **)(generator->name)._M_dataplus._M_p;
  sStack_70 = (generator->name)._M_string_length;
  local_68 = (name->_M_dataplus)._M_p;
  sStack_60 = name->_M_string_length;
  bVar7 = fmt::v7::to_string_view<char,_0>("Mixed assignment detected for variable {0}.{1}");
  format_str.data_ = (char *)bVar7.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  fmt::v7::detail::vformat_abi_cxx11_(&local_a0,(detail *)bVar7.data_,format_str,args);
  local_78._M_current = (Stmt **)auStack_58;
  local_80._M_current =
       stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  StmtException::StmtException(this,&local_a0,&local_78,&local_80);
  __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void checkout_assignment(Generator* generator, const std::string& name) {
        auto const& var = generator->get_var(name);
        AssignmentType type = AssignmentType::Undefined;
        for (auto const& stmt : var->sources()) {
            if (stmt->left()->get_var_root_parent() != var.get()) continue;
            if (type == AssignmentType ::Undefined)
                type = stmt->assign_type();
            else if (type != stmt->assign_type()) {
                std::vector<Stmt*> stmt_list;
                stmt_list.reserve(var->sources().size());
                for (const auto& st : var->sources()) stmt_list.emplace_back(st.get());
                throw StmtException(::format("Mixed assignment detected for variable {0}.{1}",
                                             generator->name, name),
                                    stmt_list.begin(), stmt_list.end());
            }
            // check assignment
            check_var_parent(generator, stmt->left(), stmt->right(), stmt.get());
        }
    }